

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall cfd::api::json::DecodeLockingScript::~DecodeLockingScript(DecodeLockingScript *this)

{
  ~DecodeLockingScript(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~DecodeLockingScript() {
    // do nothing
  }